

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::Lookup(PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
         *this,interval_t *value)

{
  int iVar1;
  long lVar2;
  long lVar3;
  hash_t hVar4;
  ulong uVar5;
  int64_t in_RDX;
  long lVar6;
  primitive_dictionary_entry_t *ppVar7;
  long lVar8;
  interval_t val;
  
  val.micros = in_RDX;
  val._0_8_ = value->micros;
  hVar4 = Hash<duckdb::interval_t>(*(duckdb **)value,val);
  uVar5 = hVar4 & this->capacity_mask;
  ppVar7 = this->dictionary + uVar5;
  if (ppVar7->index != 0xffffffff) {
    lVar2 = value->micros;
    lVar8 = (long)value->days + lVar2 / 86400000000;
    do {
      iVar1 = (ppVar7->value).months;
      if (((iVar1 == value->months) && ((ppVar7->value).days == value->days)) &&
         ((ppVar7->value).micros == lVar2)) {
        return ppVar7;
      }
      lVar3 = (ppVar7->value).micros;
      lVar6 = (long)(ppVar7->value).days + lVar3 / 86400000000;
      if ((((long)iVar1 + lVar6 / 0x1e == lVar8 / 0x1e + (long)value->months) &&
          (lVar6 % 0x1e == lVar8 % 0x1e)) && (lVar3 % 86400000000 == lVar2 % 86400000000)) {
        return ppVar7;
      }
      uVar5 = uVar5 + 1 & this->capacity_mask;
      ppVar7 = this->dictionary + uVar5;
    } while (ppVar7->index != 0xffffffff);
  }
  return ppVar7;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}